

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O1

void utest_arguments_parse_1(int *utest_result,size_t utest_index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FILE *__stream;
  bool bVar3;
  char *pcVar4;
  char *args [2];
  Arguments arguments;
  char *local_88;
  char *pcStack_80;
  Arguments local_70;
  
  paVar1 = &local_70.Input.field_2;
  local_70.Input._M_string_length = 0;
  local_70.Input.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_70.Output.field_2;
  local_70.Output._M_string_length = 0;
  local_70.Output.field_2._M_local_buf[0] = '\0';
  local_70.Width = 800;
  local_70.Height = 600;
  local_70.EnableIni = true;
  local_88 = "liveglsl";
  pcStack_80 = "shader.frag";
  local_70.Input._M_dataplus._M_p = (pointer)paVar1;
  local_70.Output._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = ArgumentsParse(2,&local_88,&local_70);
  if (bVar3) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x2d);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x2d);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    __stream = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      bVar3 = ArgumentsParse(2,&local_88,&local_70);
      pcVar4 = "true";
      if (bVar3) {
        pcVar4 = "false";
      }
      fprintf((FILE *)__stream,"    Actual : %s\n",pcVar4);
    }
    bVar3 = ArgumentsParse(2,&local_88,&local_70);
    pcVar4 = "true";
    if (bVar3) {
      pcVar4 = "false";
    }
    printf("    Actual : %s\n",pcVar4);
    *utest_result = 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.Output._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.Output._M_dataplus._M_p,
                    CONCAT71(local_70.Output.field_2._M_allocated_capacity._1_7_,
                             local_70.Output.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.Input._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.Input._M_dataplus._M_p,
                    CONCAT71(local_70.Input.field_2._M_allocated_capacity._1_7_,
                             local_70.Input.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

UTEST(arguments, parse_1) {
    Arguments arguments;

    const char* args[] = {
        "liveglsl",
        "shader.frag",
    };

    T(!ArgumentsParse(ARRAY_LENGTH(args), args, arguments));
}